

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Expression_*> * __thiscall
wasm::WATParser::ParseDefsCtx::withLoc<wasm::Expression*>
          (Result<wasm::Expression_*> *__return_storage_ptr__,ParseDefsCtx *this,
          Result<wasm::Expression_*> *res)

{
  size_t sVar1;
  _Variant_storage<false,_wasm::Expression_*,_wasm::Err> local_50;
  
  sVar1 = (this->in).pos;
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)&local_50,
             (_Copy_ctor_base<false,_wasm::Expression_*,_wasm::Err> *)res);
  withLoc<wasm::Expression*>
            (__return_storage_ptr__,this,(Index)sVar1,(Result<wasm::Expression_*> *)&local_50);
  std::__detail::__variant::_Variant_storage<false,_wasm::Expression_*,_wasm::Err>::
  ~_Variant_storage(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Result<T> withLoc(Result<T> res) {
    return withLoc(in.getPos(), res);
  }